

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O0

void MemoryProfiler::Reset(LPCWSTR name,ArenaMemoryData *memoryData)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LPCWSTR local_38;
  undefined1 local_29;
  ArenaMemoryDataSummary *pAStack_28;
  bool hasItem;
  ArenaMemoryDataSummary *arenaMemoryDataSummary;
  MemoryProfiler *memoryProfiler;
  ArenaMemoryData *memoryData_local;
  LPCWSTR name_local;
  
  arenaMemoryDataSummary = (ArenaMemoryDataSummary *)memoryData->profiler;
  local_38 = name;
  memoryProfiler = (MemoryProfiler *)memoryData;
  memoryData_local = (ArenaMemoryData *)name;
  local_29 = JsUtil::
             BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
             ::TryGetValue<char16_t*>
                       ((BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                         *)&((MemoryProfiler *)arenaMemoryDataSummary)->arenaDataMap,&local_38,
                        &stack0xffffffffffffffd8);
  if (!(bool)local_29) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp"
                       ,0x86,"(hasItem)","hasItem");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  AccumulateData(pAStack_28,(ArenaMemoryData *)memoryProfiler,true);
  (memoryProfiler->pageAllocator)._vptr_PageAllocatorBase = (_func_int **)0x0;
  (memoryProfiler->pageAllocator).super_PageAllocatorBaseCommon.virtualAllocator = (void *)0x0;
  *(undefined8 *)&(memoryProfiler->pageAllocator).super_PageAllocatorBaseCommon.allocatorType = 0;
  (memoryProfiler->pageAllocator).debugName = (char16 *)0x0;
  *(undefined8 *)&(memoryProfiler->pageAllocator).disableThreadAccessCheck = 0;
  (memoryProfiler->pageAllocator).segments.
  super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>.next.base =
       (DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)0x0;
  (memoryProfiler->pageAllocator).segments.
  super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>.prev.base =
       (DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)0x0;
  *(undefined8 *)&(memoryProfiler->pageAllocator).segments.super_RealCount = 0;
  (memoryProfiler->pageAllocator).fullSegments.
  super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>.next.base =
       (DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
       ((long)&((memoryProfiler->pageAllocator).fullSegments.
                super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>.next.base
               )->next + 1);
  return;
}

Assistant:

void
MemoryProfiler::Reset(LPCWSTR name, ArenaMemoryData * memoryData)
{
    MemoryProfiler * memoryProfiler = memoryData->profiler;
    ArenaMemoryDataSummary * arenaMemoryDataSummary;
    bool hasItem = memoryProfiler->arenaDataMap.TryGetValue((LPWSTR)name, &arenaMemoryDataSummary);
    Assert(hasItem);


    AccumulateData(arenaMemoryDataSummary, memoryData, true);
    memoryData->allocatedBytes = 0;
    memoryData->alignmentBytes = 0;
    memoryData->requestBytes = 0;
    memoryData->requestCount = 0;
    memoryData->reuseBytes = 0;
    memoryData->reuseCount = 0;
    memoryData->freelistBytes = 0;
    memoryData->freelistCount = 0;
    memoryData->resetCount++;
}